

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf.cpp
# Opt level: O3

gguf_context * gguf_init_from_file_impl(FILE *file,gguf_init_params params)

{
  pointer pgVar1;
  pointer pgVar2;
  iterator __position;
  ggml_init_params params_00;
  pointer pcVar3;
  bool bVar4;
  int iVar5;
  uint32_t uVar6;
  gguf_context *pgVar7;
  size_t sVar8;
  ulong uVar9;
  int64_t iVar10;
  ulong uVar11;
  size_t sVar12;
  size_t sVar13;
  long lVar14;
  ggml_context *ctx;
  size_t sVar15;
  ggml_tensor *pgVar16;
  uint uVar17;
  FILE *__s1;
  gguf_reader gVar18;
  pointer pgVar19;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *extraout_RDX_04;
  void *extraout_RDX_05;
  void *pvVar20;
  void *extraout_RDX_06;
  void *extraout_RDX_07;
  undefined1 *__buf;
  undefined1 *extraout_RDX_08;
  undefined1 *extraout_RDX_09;
  byte bVar21;
  size_type *psVar22;
  long lVar23;
  FILE *pFVar24;
  ulong uVar25;
  vector<gguf_tensor_info,std::allocator<gguf_tensor_info>> *pvVar26;
  char *pcVar27;
  ggml_type type;
  ulong uVar28;
  gguf_reader gr;
  vector<gguf_tensor_info,std::allocator<gguf_tensor_info>> *in_stack_fffffffffffffdf0;
  vector<gguf_kv,_std::allocator<gguf_kv>_> *in_stack_fffffffffffffdf8;
  gguf_context *pgVar29;
  uint local_1f4;
  uint64_t n;
  ulong local_1e8;
  undefined1 local_1e0;
  undefined7 uStack_1df;
  uint local_1cc;
  int64_t n_tensors;
  ggml_context **local_1c0;
  int64_t n_kv;
  ggml_tensor *local_1b0;
  vector<char,_std::allocator<char>_> magic;
  long local_190;
  long local_188;
  size_t local_180 [27];
  char local_a8 [80];
  undefined1 local_58 [16];
  long local_48;
  undefined8 uStack_40;
  byte local_38;
  
  local_1c0 = params.ctx;
  gr.file = file;
  pgVar7 = (gguf_context *)operator_new(0x58);
  pgVar7->version = 3;
  (pgVar7->kv).super__Vector_base<gguf_kv,_std::allocator<gguf_kv>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (pgVar7->kv).super__Vector_base<gguf_kv,_std::allocator<gguf_kv>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  (pgVar7->kv).super__Vector_base<gguf_kv,_std::allocator<gguf_kv>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  (pgVar7->info).super__Vector_base<gguf_tensor_info,_std::allocator<gguf_tensor_info>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pgVar7->info).super__Vector_base<gguf_tensor_info,_std::allocator<gguf_tensor_info>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pgVar7->info).super__Vector_base<gguf_tensor_info,_std::allocator<gguf_tensor_info>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pgVar7->alignment = 0x20;
  pgVar7->offset = 0;
  pgVar7->size = 0;
  pgVar7->data = (void *)0x0;
  magic.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  magic.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  magic.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  bVar4 = gguf_reader::read<char>(&gr,&magic,4);
  if (!bVar4) {
    gguf_init_from_file_impl();
    return (gguf_context *)0x0;
  }
  if (magic.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      magic.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
     ) {
    if (magic.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) goto LAB_0013c025;
  }
  else {
    uVar17 = 1;
    uVar11 = 0;
    do {
      if (magic.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar11] != "GGUF"[uVar11]) {
        gguf_init_from_file_impl();
        return (gguf_context *)0x0;
      }
      uVar11 = (ulong)uVar17;
      uVar17 = uVar17 + 1;
    } while (uVar11 < (ulong)((long)magic.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                    super__Vector_impl_data._M_finish -
                             (long)magic.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                   super__Vector_impl_data._M_start));
LAB_0013c025:
    operator_delete(magic.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)magic.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)magic.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  n_kv = 0;
  n_tensors = 0;
  local_1b0 = (ggml_tensor *)file;
  sVar8 = fread(pgVar7,1,4,(FILE *)gr.file);
  if (sVar8 != 4) goto LAB_0013cb16;
  uVar17 = pgVar7->version;
  bVar4 = uVar17 == 1;
  if (bVar4) {
    fprintf(_stderr,"%s: GGUFv1 is no longer supported, please use a more up-to-date version\n",
            "gguf_init_from_file_impl");
    uVar17 = pgVar7->version;
  }
  bVar4 = !bVar4;
  uVar11 = (ulong)bVar4;
  if (3 < uVar17) {
    fprintf(_stderr,
            "%s: this GGUF file is version %u but this software only supports up to version %d\n",
            "gguf_init_from_file_impl",(ulong)uVar17,3);
    goto LAB_0013cb16;
  }
  if ((!bVar4) || (sVar8 = fread(&n_tensors,1,8,(FILE *)gr.file), sVar8 != 8)) goto LAB_0013cb16;
  if ((ulong)n_tensors < 0xbe82fa0be82fa1) {
    sVar8 = fread(&n_kv,1,8,(FILE *)gr.file);
    if (sVar8 != 8) goto LAB_0013cb16;
    if ((ulong)n_kv < 0x2e8ba2e8ba2e8bb) {
      local_1cc = params._0_4_;
      pgVar29 = pgVar7;
      if (n_kv != 0) {
        in_stack_fffffffffffffdf8 = &pgVar7->kv;
        pvVar26 = (vector<gguf_tensor_info,std::allocator<gguf_tensor_info>> *)0x0;
        gVar18.file = (FILE *)n_kv;
        pvVar20 = extraout_RDX;
        do {
          magic.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)&magic.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage;
          magic.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)0x0;
          magic.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage =
               (pointer)((ulong)magic.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00);
          n = 1;
          uVar9 = gguf_reader::read(&gr,(int)&magic,pvVar20,(size_t)gVar18.file);
          pcVar3 = magic.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          __s1 = (FILE *)magic.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start;
          uVar11 = uVar9 & 0xffffffff;
          pvVar20 = extraout_RDX_00;
          if ((char)uVar9 == '\0') {
            bVar4 = false;
          }
          else {
            pgVar1 = (pgVar7->kv).super__Vector_base<gguf_kv,_std::allocator<gguf_kv>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pgVar2 = (pgVar7->kv).super__Vector_base<gguf_kv,_std::allocator<gguf_kv>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            psVar22 = &(pgVar1->key)._M_string_length;
            uVar9 = 0;
            pgVar7 = pgVar29;
            do {
              if ((ulong)(((long)pgVar2 - (long)pgVar1 >> 3) * 0x2e8ba2e8ba2e8ba3) <= uVar9) {
                local_1f4 = 0xffffffff;
                gVar18.file = gr.file;
                sVar8 = fread(&local_1f4,1,4,(FILE *)gr.file);
                if (sVar8 == 4) {
                  uVar17 = local_1f4;
                  pgVar29 = pgVar7;
                  if (local_1f4 == 9) {
                    local_1f4 = 0xffffffff;
                    gVar18 = gr;
                    sVar8 = fread(&local_1f4,1,4,(FILE *)gr.file);
                    uVar17 = local_1f4;
                    pvVar20 = extraout_RDX_03;
                    if ((sVar8 != 4) ||
                       (gVar18 = gr, sVar8 = fread(&n,1,8,(FILE *)gr.file),
                       pvVar20 = extraout_RDX_04, sVar8 != 8)) {
                      bVar4 = false;
                      uVar11 = 0;
                      in_stack_fffffffffffffdf0 = pvVar26;
                      goto LAB_0013c2bc;
                    }
                  }
                  if (uVar17 < 0xd) {
                    pgVar7 = (gguf_context *)
                             (*(code *)(&DAT_00159a48 + *(int *)(&DAT_00159a48 + (ulong)uVar17 * 4))
                             )();
                    return pgVar7;
                  }
                  uVar11 = 0;
                  gVar18.file = (FILE *)magic.super__Vector_base<char,_std::allocator<char>_>.
                                        _M_impl.super__Vector_impl_data._M_start;
                  fprintf(_stderr,"%s: key \'%s\' has invalid GGUF type %d\n",
                          "gguf_init_from_file_impl",
                          magic.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start,(ulong)uVar17);
                  bVar4 = true;
                  pvVar20 = extraout_RDX_07;
                  in_stack_fffffffffffffdf0 = pvVar26;
                  goto LAB_0013c2bc;
                }
                uVar11 = 0;
                pvVar20 = extraout_RDX_02;
                break;
              }
              if ((pcVar3 == (pointer)*psVar22) &&
                 ((pcVar3 == (pointer)0x0 ||
                  (iVar5 = bcmp(__s1,(((string *)(psVar22 + -1))->_M_dataplus)._M_p,(size_t)pcVar3),
                  pvVar20 = extraout_RDX_01, iVar5 == 0)))) {
                bVar4 = false;
                in_stack_fffffffffffffdf0 = pvVar26;
                fprintf(_stderr,"%s: duplicate key \'%s\' for tensors %zu and %li \n",
                        "gguf_init_from_file_impl",__s1,uVar9);
                uVar11 = 0;
                gVar18.file = __s1;
                pvVar20 = extraout_RDX_06;
                pgVar29 = pgVar7;
                goto LAB_0013c2bc;
              }
              uVar9 = uVar9 + 1;
              psVar22 = psVar22 + 0xb;
            } while ((char)uVar11 != '\0');
            bVar4 = false;
            in_stack_fffffffffffffdf0 = pvVar26;
            pgVar29 = pgVar7;
          }
LAB_0013c2bc:
          if ((pointer *)
              magic.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
              _M_start !=
              &magic.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
               ._M_end_of_storage) {
            operator_delete(magic.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (ulong)(magic.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage + 1));
            pvVar20 = extraout_RDX_05;
          }
        } while ((bVar4) && (pvVar26 = pvVar26 + 1, ((long)pvVar26 < n_kv & (byte)uVar11) == 1));
      }
      if ((char)uVar11 == '\0') {
        gguf_init_from_file_impl();
        return (gguf_context *)0x0;
      }
      if (((long)(pgVar7->kv).super__Vector_base<gguf_kv,_std::allocator<gguf_kv>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(pgVar7->kv).super__Vector_base<gguf_kv,_std::allocator<gguf_kv>_>._M_impl.
                 super__Vector_impl_data._M_start >> 3) * 0x2e8ba2e8ba2e8ba3 - n_kv != 0) {
        pcVar27 = "int64_t(ctx->kv.size()) == n_kv";
        iVar5 = 0x1c7;
LAB_0013cfe1:
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/gguf.cpp"
                   ,iVar5,"GGML_ASSERT(%s) failed",pcVar27);
      }
      iVar10 = gguf_find_key(pgVar7,"general.alignment");
      gVar18.file = (FILE *)0x20;
      if ((int)iVar10 != -1) {
        uVar6 = gguf_get_val_u32(pgVar7,(long)(int)iVar10);
        gVar18.file = (FILE *)(ulong)uVar6;
      }
      pgVar7->alignment = (size_t)gVar18.file;
      __buf = (undefined1 *)((ulong)gVar18.file ^ (ulong)(gVar18.file[-1]._unused2 + 0x13));
      if (__buf <= gVar18.file[-1]._unused2 + 0x13) {
        fprintf(_stderr,"%s: alignment %zu is not a power of 2\n","gguf_init_from_file_impl");
        goto LAB_0013cf57;
      }
      if (0 < n_tensors) {
        in_stack_fffffffffffffdf0 =
             (vector<gguf_tensor_info,std::allocator<gguf_tensor_info>> *)&pgVar7->info;
        uVar9 = 0;
        do {
          n = (uint64_t)&local_1e0;
          local_1e8 = 0;
          local_1e0 = 0;
          uVar11 = gguf_reader::read(&gr,(int)&n,__buf,(size_t)gVar18.file);
          uVar25 = local_1e8;
          uVar11 = uVar11 & 0xffffffff;
          if (local_1e8 < 0x40) {
            ggml_set_name((ggml_tensor *)&magic,(char *)n);
            if ((uVar9 != 0 & (byte)uVar11) == 1) {
              pcVar27 = (char *)(*(long *)in_stack_fffffffffffffdf0 + 0x100);
              uVar28 = 0;
              do {
                iVar5 = strcmp(local_a8,pcVar27);
                if (iVar5 == 0) {
                  uVar11 = 0;
                  fprintf(_stderr,"%s: duplicate tensor name \'%s\' for tensors %li and %li\n",
                          "gguf_init_from_file_impl",local_a8,uVar28);
                  break;
                }
                uVar28 = uVar28 + 1;
                pcVar27 = pcVar27 + 0x158;
              } while (uVar28 < uVar9);
            }
          }
          else {
            uVar11 = 0;
            fprintf(_stderr,"%s: tensor name %li is too long: %zu >= %d\n",
                    "gguf_init_from_file_impl",uVar9,local_1e8);
          }
          pgVar7 = pgVar29;
          if ((undefined1 *)n != &local_1e0) {
            operator_delete((void *)n,CONCAT71(uStack_1df,local_1e0) + 1);
            pgVar7 = pgVar29;
          }
          pgVar29 = pgVar7;
          if ((0x3f < uVar25) || ((char)uVar11 == '\0')) goto LAB_0013cc1e;
          n = CONCAT44(n._4_4_,0xffffffff);
          sVar8 = fread(&n,1,4,(FILE *)gr.file);
          uVar25 = n & 0xffffffff;
          if (4 < uVar25) {
            fprintf(_stderr,"%s: tensor \'%s\' has invalid number of dimensions: %u > %u\n",
                    "gguf_init_from_file_impl",local_a8,uVar25);
LAB_0013cc16:
            uVar11 = 0;
            pgVar29 = pgVar7;
            goto LAB_0013cc1e;
          }
          if (sVar8 != 4) goto LAB_0013cc16;
          uVar11 = 1;
          lVar23 = 0x10;
          uVar28 = 0;
          do {
            (&magic.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage)[uVar28] = (pointer)0x1;
            if (uVar28 < uVar25) {
              sVar8 = fread((void *)((long)&magic.super__Vector_base<char,_std::allocator<char>_>.
                                            _M_impl.super__Vector_impl_data._M_start + lVar23),1,8,
                            (FILE *)gr.file);
              uVar11 = (ulong)(sVar8 == 8);
              if ((long)(&magic.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage)[uVar28] < 0) {
                pcVar27 = "%s: tensor \'%s\' dimension %u has invalid number of elements: %li < 0\n"
                ;
                uVar28 = uVar28 & 0xffffffff;
                pFVar24 = _stderr;
                goto LAB_0013cacb;
              }
            }
            if (2 < uVar28) break;
            uVar28 = uVar28 + 1;
            lVar23 = lVar23 + 8;
          } while ((char)uVar11 != '\0');
          pgVar29 = pgVar7;
          if (uVar11 == 0) goto LAB_0013cc1e;
          if (((SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(local_190),0) <=
                (long)magic.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage) ||
              (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(local_188),0) <=
               (long)magic.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage * local_190)) ||
             (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) /
                     SEXT816((long)local_180[0]),0) <=
              (long)magic.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage * local_190 * local_188)) {
            fprintf(_stderr,
                    "%s: total number of elements in tensor \'%s\' with shape (%li, %li, %li, %li) is >= %li\n"
                    ,"gguf_init_from_file_impl",local_a8,
                    magic.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,local_190,local_188,local_180[0],
                    0x7fffffffffffffff);
            goto LAB_0013cc16;
          }
          n = CONCAT44(n._4_4_,0xffffffff);
          sVar8 = fread(&n,1,4,(FILE *)gr.file);
          pFVar24 = _stderr;
          if (sVar8 == 4) {
            magic.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)CONCAT44(magic.super__Vector_base<char,_std::allocator<char>_>.
                                         _M_impl.super__Vector_impl_data._M_start._4_4_,(ggml_type)n
                                        );
            type = (ggml_type)n;
          }
          else {
            type = (ggml_type)
                   magic.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          }
          if (0x26 < type) {
            ggml_type_name(type);
            pcVar27 = "%s: tensor \'%s\' has invalid ggml type %d (%s)\n";
            uVar28 = (ulong)type;
LAB_0013cacb:
            uVar11 = 0;
            fprintf(pFVar24,pcVar27,"gguf_init_from_file_impl",local_a8,uVar28);
            pgVar29 = pgVar7;
            goto LAB_0013cc1e;
          }
          sVar12 = ggml_type_size(type);
          iVar10 = ggml_blck_size((ggml_type)
                                  magic.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          pcVar3 = magic.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pFVar24 = _stderr;
          if ((iVar10 == 0) ||
             ((long)magic.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage % iVar10 != 0)) {
            pcVar27 = ggml_type_name((ggml_type)
                                     magic.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                     super__Vector_impl_data._M_start);
            uVar11 = 0;
            fprintf(pFVar24,
                    "%s: tensor \'%s\' of type %d (%s) has %ld elements per row, not a multiple of block size (%ld)\n"
                    ,"gguf_init_from_file_impl",local_a8,(ulong)pcVar3 & 0xffffffff,pcVar27,
                    magic.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,iVar10);
            pgVar29 = pgVar7;
            goto LAB_0013cc1e;
          }
          local_180[2] = ((long)magic.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage / iVar10) * sVar12;
          lVar23 = 3;
          sVar13 = local_180[2];
          do {
            sVar13 = sVar13 * (long)(&magic.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                      super__Vector_impl_data._M_start)[lVar23];
            local_180[lVar23] = sVar13;
            lVar23 = lVar23 + 1;
          } while (lVar23 != 5);
          local_180[1] = sVar12;
          if (sVar8 != 4) goto LAB_0013cc16;
          gVar18 = gr;
          pgVar29 = pgVar7;
          sVar8 = fread(local_58,1,8,(FILE *)gr.file);
          __position._M_current =
               (pgVar7->info).
               super__Vector_base<gguf_tensor_info,_std::allocator<gguf_tensor_info>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (pgVar7->info).super__Vector_base<gguf_tensor_info,_std::allocator<gguf_tensor_info>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<gguf_tensor_info,std::allocator<gguf_tensor_info>>::
            _M_realloc_insert<gguf_tensor_info_const&>
                      (in_stack_fffffffffffffdf0,__position,(gguf_tensor_info *)&magic);
            __buf = extraout_RDX_09;
          }
          else {
            memcpy(__position._M_current,&magic,0x158);
            (pgVar7->info).super__Vector_base<gguf_tensor_info,_std::allocator<gguf_tensor_info>_>.
            _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
            __buf = extraout_RDX_08;
          }
        } while ((sVar8 == 8) && (uVar9 = uVar9 + 1, (long)uVar9 < n_tensors));
        uVar11 = (ulong)(sVar8 == 8);
      }
LAB_0013cc1e:
      pgVar16 = local_1b0;
      if ((uVar11 & 1) == 0) {
        gguf_init_from_file_impl();
        return (gguf_context *)0x0;
      }
      lVar23 = ((long)(pgVar7->info).
                      super__Vector_base<gguf_tensor_info,_std::allocator<gguf_tensor_info>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(pgVar7->info).
                      super__Vector_base<gguf_tensor_info,_std::allocator<gguf_tensor_info>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 3) * -0x7d05f417d05f417d;
      if (lVar23 - n_tensors != 0) {
        pcVar27 = "int64_t(ctx->info.size()) == n_tensors";
        iVar5 = 0x24d;
        goto LAB_0013cfe1;
      }
      lVar14 = ftell((FILE *)local_1b0);
      iVar5 = fseek((FILE *)pgVar16,-pgVar7->alignment & (lVar14 + pgVar7->alignment) - 1,0);
      if (iVar5 != 0) {
        gguf_init_from_file_impl();
        return (gguf_context *)0x0;
      }
      sVar12 = ftell((FILE *)pgVar16);
      pgVar7->offset = sVar12;
      pgVar7->size = 0;
      pgVar19 = (pgVar7->info).
                super__Vector_base<gguf_tensor_info,_std::allocator<gguf_tensor_info>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((pgVar7->info).super__Vector_base<gguf_tensor_info,_std::allocator<gguf_tensor_info>_>.
          _M_impl.super__Vector_impl_data._M_finish != pgVar19) {
        lVar14 = 0x100;
        sVar12 = 0;
        uVar9 = 0;
        do {
          if (*(size_t *)((long)(pgVar19->t).op_params + lVar14 + -4) != sVar12) {
            fprintf(_stderr,"%s: tensor \'%s\' has offset %lu, expected %zu\n",
                    "gguf_init_from_file_impl",(long)(pgVar19->t).ne + lVar14 + -0x10);
            fprintf(_stderr,"%s: failed to read tensor data\n","gguf_init_from_file_impl");
            goto LAB_0013cf57;
          }
          sVar12 = ggml_nbytes((ggml_tensor *)((long)pgVar19 + lVar14 + -0x100));
          sVar12 = (-pgVar7->alignment & (sVar12 + pgVar7->alignment) - 1) + pgVar7->size;
          pgVar7->size = sVar12;
          uVar9 = uVar9 + 1;
          pgVar19 = (pgVar7->info).
                    super__Vector_base<gguf_tensor_info,_std::allocator<gguf_tensor_info>_>._M_impl.
                    super__Vector_impl_data._M_start;
          lVar14 = lVar14 + 0x158;
        } while (uVar9 < (ulong)(((long)(pgVar7->info).
                                        super__Vector_base<gguf_tensor_info,_std::allocator<gguf_tensor_info>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)pgVar19
                                 >> 3) * -0x7d05f417d05f417d));
      }
      uVar17 = local_1cc;
      if (local_1c0 == (ggml_context **)0x0) {
        return pgVar7;
      }
      bVar21 = (byte)local_1cc;
      if ((local_1cc & 1) == 0) {
        sVar12 = ggml_tensor_overhead();
        local_48 = sVar12 * (lVar23 + 1) + pgVar7->size;
      }
      else {
        sVar12 = ggml_tensor_overhead();
        local_48 = sVar12 * lVar23;
      }
      local_38 = bVar21 & 1;
      uStack_40 = 0;
      params_00.mem_buffer = in_stack_fffffffffffffdf8;
      params_00.mem_size = (size_t)in_stack_fffffffffffffdf0;
      params_00._16_8_ = pgVar29;
      ctx = ggml_init(params_00);
      *local_1c0 = ctx;
      if (ctx == (ggml_context *)0x0) {
        gguf_init_from_file_impl();
        goto LAB_0013cf57;
      }
      if ((uVar17 & 1) == 0) {
        pgVar16 = ggml_new_tensor_1d(ctx,GGML_TYPE_I8,pgVar7->size);
        if (pgVar16 != (ggml_tensor *)0x0) {
          ggml_set_name(pgVar16,"GGUF tensor data binary blob");
          sVar8 = pgVar7->size;
          sVar15 = fread(pgVar16->data,1,sVar8,(FILE *)gr.file);
          if (sVar15 == sVar8) {
            pgVar7->data = pgVar16->data;
            uVar11 = 1;
            goto LAB_0013cdfd;
          }
        }
        gguf_init_from_file_impl();
LAB_0013cf57:
        gguf_free(pgVar7);
        return (gguf_context *)0x0;
      }
      pgVar16 = (ggml_tensor *)0x0;
LAB_0013cdfd:
      ggml_set_no_alloc(ctx,true);
      pgVar19 = (pgVar7->info).
                super__Vector_base<gguf_tensor_info,_std::allocator<gguf_tensor_info>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((pgVar7->info).super__Vector_base<gguf_tensor_info,_std::allocator<gguf_tensor_info>_>.
          _M_impl.super__Vector_impl_data._M_finish == pgVar19) {
        pgVar7 = pgVar29;
        if ((uVar11 & 1) == 0) {
LAB_0013cf43:
          gguf_init_from_file_impl();
          goto LAB_0013cf57;
        }
      }
      else {
        lVar23 = 0x100;
        uVar9 = 0;
        local_1b0 = pgVar16;
        do {
          pgVar16 = ggml_new_tensor(ctx,*(ggml_type *)((long)pgVar19 + lVar23 + -0x100),4,
                                    (int64_t *)((long)pgVar19 + lVar23 + -0xf0));
          pgVar7 = pgVar29;
          if (((uVar11 & 1) == 0) || (pgVar16 == (ggml_tensor *)0x0)) goto LAB_0013cf43;
          ggml_set_name(pgVar16,(char *)((long)(pgVar19->t).ne + lVar23 + -0x10));
          if ((local_1cc & 1) == 0) {
            pgVar16->data =
                 (void *)((long)local_1b0->data +
                         *(long *)((long)(pgVar19->t).op_params + lVar23 + -4));
          }
          uVar9 = uVar9 + 1;
          pgVar19 = (pgVar29->info).
                    super__Vector_base<gguf_tensor_info,_std::allocator<gguf_tensor_info>_>._M_impl.
                    super__Vector_impl_data._M_start;
          lVar23 = lVar23 + 0x158;
          uVar11 = 1;
        } while (uVar9 < (ulong)(((long)(pgVar29->info).
                                        super__Vector_base<gguf_tensor_info,_std::allocator<gguf_tensor_info>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)pgVar19
                                 >> 3) * -0x7d05f417d05f417d));
      }
      ggml_set_no_alloc(ctx,(_Bool)((byte)local_1cc & 1));
      return pgVar29;
    }
    pcVar27 = "%s: number of key value pairs is %li but must be in [0, %zu]\n";
  }
  else {
    pcVar27 = "%s: number of tensors is %li but must be in [0, %zu]\n";
  }
  fprintf(_stderr,pcVar27,"gguf_init_from_file_impl");
LAB_0013cb16:
  gguf_init_from_file_impl();
  return (gguf_context *)0x0;
}

Assistant:

struct gguf_context * gguf_init_from_file_impl(FILE * file, struct gguf_init_params params) {
    const struct gguf_reader gr(file);
    struct gguf_context * ctx = new gguf_context;

    bool ok = true;

    // file magic
    {
        std::vector<char> magic;
        ok = ok && gr.read(magic, 4);

        if (!ok) {
            fprintf(stderr, "%s: failed to read magic\n", __func__);
            gguf_free(ctx);
            return nullptr;
        }

        for (uint32_t i = 0; i < magic.size(); i++) {
            if (magic[i] != GGUF_MAGIC[i]) {
                fprintf(stderr, "%s: invalid magic characters: '%c%c%c%c', expected 'GGUF'\n", __func__, magic[0], magic[1], magic[2], magic[3]);
                gguf_free(ctx);
                return nullptr;
            }
        }
    }

    // header
    int64_t n_kv      = 0;
    int64_t n_tensors = 0;

    if (ok && gr.read(ctx->version)) {
        if (ctx->version == 1) {
            fprintf(stderr, "%s: GGUFv1 is no longer supported, please use a more up-to-date version\n", __func__);
            ok = false;
        }
        if (ctx->version > GGUF_VERSION) {
            fprintf(stderr, "%s: this GGUF file is version %" PRIu32 " but this software only supports up to version %d\n",
                __func__, ctx->version, GGUF_VERSION);
            ok = false;
        }
    } else {
        ok = false;
    }

    if (ok && gr.read(n_tensors)) {
        static_assert(sizeof(size_t) <= 8 && sizeof(gguf_tensor_info) >= 2, "int64_t insufficient for indexing");
        if (n_tensors < 0 || n_tensors > int64_t(SIZE_MAX/sizeof(gguf_tensor_info))) {
            fprintf(stderr, "%s: number of tensors is %" PRIi64 " but must be in [0, %zu]\n",
                __func__, n_tensors, SIZE_MAX/sizeof(gguf_tensor_info));
            ok = false;
        }
    } else {
        ok = false;
    }

    if (ok && gr.read(n_kv)) {
        static_assert(sizeof(size_t) <= 8 && sizeof(gguf_tensor_info) >= 2, "int64_t insufficient for indexing");
        if (n_kv < 0 || n_kv > int64_t(SIZE_MAX/sizeof(gguf_kv))) {
            fprintf(stderr, "%s: number of key value pairs is %" PRIi64 " but must be in [0, %zu]\n",
                    __func__, n_kv, SIZE_MAX/sizeof(gguf_kv));
            ok = false;
        }
    } else {
        ok = false;
    }

    if (!ok) {
        fprintf(stderr, "%s: failed to read header\n", __func__);
        gguf_free(ctx);
        return nullptr;
    }

    // KV pairs
    {
        for (int64_t i = 0; ok && i < n_kv; ++i) {
            std::string key;
            gguf_type   type     = gguf_type(-1);
            bool        is_array = false;
            uint64_t    n        = 1;

            try {
                ok = ok && gr.read(key);
            } catch (std::length_error &) {
                fprintf(stderr, "%s: encountered length_error while reading key %" PRIi64 "\n", __func__, i);
                ok = false;
            } catch (std::bad_alloc &) {
                fprintf(stderr, "%s: encountered bad_alloc error while reading key %" PRIi64 "\n", __func__, i);
                ok = false;
            }
            for (size_t j = 0; ok && j < ctx->kv.size(); ++j) {
                if (key == ctx->kv[j].key) {
                    fprintf(stderr, "%s: duplicate key '%s' for tensors %zu and %" PRIi64 " \n", __func__, key.c_str(), j, i);
                    ok = false;
                }
            }
            if (!ok) {
                break;
            }

            ok = ok && gr.read(type);
            if (type == GGUF_TYPE_ARRAY) {
                is_array = true;
                ok = ok && gr.read(type);
                ok = ok && gr.read(n);
            }
            if (!ok) {
                break;
            }

            switch (type) {
                case GGUF_TYPE_UINT8:   ok = ok && gguf_read_emplace_helper<uint8_t>    (gr, ctx->kv, key, is_array, n); break;
                case GGUF_TYPE_INT8:    ok = ok && gguf_read_emplace_helper<int8_t>     (gr, ctx->kv, key, is_array, n); break;
                case GGUF_TYPE_UINT16:  ok = ok && gguf_read_emplace_helper<uint16_t>   (gr, ctx->kv, key, is_array, n); break;
                case GGUF_TYPE_INT16:   ok = ok && gguf_read_emplace_helper<int16_t>    (gr, ctx->kv, key, is_array, n); break;
                case GGUF_TYPE_UINT32:  ok = ok && gguf_read_emplace_helper<uint32_t>   (gr, ctx->kv, key, is_array, n); break;
                case GGUF_TYPE_INT32:   ok = ok && gguf_read_emplace_helper<int32_t>    (gr, ctx->kv, key, is_array, n); break;
                case GGUF_TYPE_FLOAT32: ok = ok && gguf_read_emplace_helper<float>      (gr, ctx->kv, key, is_array, n); break;
                case GGUF_TYPE_BOOL:    ok = ok && gguf_read_emplace_helper<bool>       (gr, ctx->kv, key, is_array, n); break;
                case GGUF_TYPE_STRING:  ok = ok && gguf_read_emplace_helper<std::string>(gr, ctx->kv, key, is_array, n); break;
                case GGUF_TYPE_UINT64:  ok = ok && gguf_read_emplace_helper<uint64_t>   (gr, ctx->kv, key, is_array, n); break;
                case GGUF_TYPE_INT64:   ok = ok && gguf_read_emplace_helper<int64_t>    (gr, ctx->kv, key, is_array, n); break;
                case GGUF_TYPE_FLOAT64: ok = ok && gguf_read_emplace_helper<double>     (gr, ctx->kv, key, is_array, n); break;
                case GGUF_TYPE_ARRAY:
                default:
                    {
                        fprintf(stderr, "%s: key '%s' has invalid GGUF type %d\n", __func__, key.c_str(), type);
                        ok = false;
                    } break;
            }
        }

        if (!ok) {
            fprintf(stderr, "%s: failed to read key-value pairs\n", __func__);
            gguf_free(ctx);
            return nullptr;
        }
        GGML_ASSERT(int64_t(ctx->kv.size()) == n_kv);

        const int alignment_idx = gguf_find_key(ctx, GGUF_KEY_GENERAL_ALIGNMENT);
        ctx->alignment = alignment_idx == -1 ? GGUF_DEFAULT_ALIGNMENT : gguf_get_val_u32(ctx, alignment_idx);

        if (ctx->alignment == 0 || (ctx->alignment & (ctx->alignment - 1)) != 0) {
            fprintf(stderr, "%s: alignment %zu is not a power of 2\n", __func__, ctx->alignment);
            gguf_free(ctx);
            return nullptr;
        }
    }

    // read the tensor info
    for (int64_t i = 0; ok && i < n_tensors; ++i) {
        struct gguf_tensor_info info;

        // tensor name
        {
            std::string name;
            try {
                ok = ok && gr.read(name);
            } catch (std::length_error &) {
                fprintf(stderr, "%s: encountered length_error while reading tensor name %" PRIi64 "\n", __func__, i);
                ok = false;
            } catch (std::bad_alloc &) {
                fprintf(stderr, "%s: encountered bad_alloc error while reading tensor name %" PRIi64 "\n", __func__, i);
                ok = false;
            }
            if (name.length() >= GGML_MAX_NAME) {
                fprintf(stderr, "%s: tensor name %" PRIi64 " is too long: %zu >= %d\n", __func__, i, name.length(), GGML_MAX_NAME);
                ok = false;
                break;
            }
            ggml_set_name(&info.t, name.c_str());

            // make sure there are no duplicate tensor names
            for (int64_t j = 0; ok && j < i; ++j) {
                if (strcmp(info.t.name, ctx->info[j].t.name) == 0) {
                    fprintf(stderr, "%s: duplicate tensor name '%s' for tensors %" PRIi64 " and %" PRIi64 "\n", __func__, info.t.name, j, i);
                    ok = false;
                    break;
                }
            }
        }
        if (!ok) {
            break;
        }

        // tensor shape
        {
            uint32_t n_dims = -1;
            ok = ok && gr.read(n_dims);
            if (n_dims > GGML_MAX_DIMS) {
                fprintf(stderr, "%s: tensor '%s' has invalid number of dimensions: %" PRIu32 " > %" PRIu32 "\n",
                    __func__, info.t.name, n_dims, GGML_MAX_DIMS);
                ok = false;
                break;
            }
            for (uint32_t j = 0; ok && j < GGML_MAX_DIMS; ++j) {
                info.t.ne[j] = 1;
                if (j < n_dims) {
                    ok = ok && gr.read(info.t.ne[j]);
                }

                // check that all ne are non-negative
                if (info.t.ne[j] < 0) {
                    fprintf(stderr, "%s: tensor '%s' dimension %" PRIu32 " has invalid number of elements: %" PRIi64 " < 0\n",
                        __func__, info.t.name, j, info.t.ne[j]);
                    ok = false;
                    break;
                }
            }

            // check that the total number of elements is representable
            if (ok && ((INT64_MAX/info.t.ne[1] <= info.t.ne[0]) ||
                       (INT64_MAX/info.t.ne[2] <= info.t.ne[0]*info.t.ne[1]) ||
                       (INT64_MAX/info.t.ne[3] <= info.t.ne[0]*info.t.ne[1]*info.t.ne[2]))) {

                fprintf(stderr, "%s: total number of elements in tensor '%s' with shape "
                    "(%" PRIi64 ", %" PRIi64 ", %" PRIi64 ", %" PRIi64 ") is >= %" PRIi64 "\n",
                    __func__, info.t.name, info.t.ne[0], info.t.ne[1], info.t.ne[2], info.t.ne[3], INT64_MAX);
                ok = false;
                break;
            }
        }
        if (!ok) {
            break;
        }

        // tensor type
        {
            ok = ok && gr.read(info.t.type);

            // check that tensor type is within defined range
            if (info.t.type < 0 || info.t.type >= GGML_TYPE_COUNT) {
                fprintf(stderr, "%s: tensor '%s' has invalid ggml type %d (%s)\n",
                    __func__, info.t.name, info.t.type, ggml_type_name(info.t.type));
                ok = false;
                break;
            }
            const size_t  type_size = ggml_type_size(info.t.type);
            const int64_t blck_size = ggml_blck_size(info.t.type);

            // check that row size is divisible by block size
            if (blck_size == 0 || info.t.ne[0] % blck_size != 0) {
                fprintf(stderr, "%s: tensor '%s' of type %d (%s) has %" PRId64 " elements per row, "
                    "not a multiple of block size (%" PRId64 ")\n",
                    __func__, info.t.name, (int) info.t.type, ggml_type_name(info.t.type), info.t.ne[0], blck_size);
                ok = false;
                break;
            }

            // calculate byte offsets given the tensor shape and type
            info.t.nb[0] = type_size;
            info.t.nb[1] = info.t.nb[0]*(info.t.ne[0]/blck_size);
            for (int j = 2; j < GGML_MAX_DIMS; ++j) {
                info.t.nb[j] = info.t.nb[j - 1]*info.t.ne[j - 1];
            }
        }
        if (!ok) {
            break;
        }

        // tensor data offset within buffer
        ok = ok && gr.read(info.offset);

        ctx->info.push_back(info);
    }

    if (!ok) {
        fprintf(stderr, "%s: failed to read tensor info\n", __func__);
        gguf_free(ctx);
        return nullptr;
    }
    GGML_ASSERT(int64_t(ctx->info.size()) == n_tensors);

    // we require the data section to be aligned, so take into account any padding
    if (fseek(file, GGML_PAD(ftell(file), ctx->alignment), SEEK_SET) != 0) {
        fprintf(stderr, "%s: failed to seek to beginning of data section\n", __func__);
        gguf_free(ctx);
        return nullptr;
    }

    // store the current file offset - this is where the data section starts
    ctx->offset = ftell(file);

    // compute the total size of the data section, taking into account the alignment
    {
        ctx->size = 0;
        for (size_t i = 0; i < ctx->info.size(); ++i) {
            const gguf_tensor_info & ti = ctx->info[i];
            if (ti.offset != ctx->size) {
                fprintf(stderr, "%s: tensor '%s' has offset %" PRIu64 ", expected %zu\n",
                    __func__, ti.t.name, ti.offset, ctx->size);
                fprintf(stderr, "%s: failed to read tensor data\n", __func__);
                gguf_free(ctx);
                return nullptr;
            }
            ctx->size += GGML_PAD(ggml_nbytes(&ti.t), ctx->alignment);
        }
    }

    // load the tensor data only if requested
    if (params.ctx != nullptr) {
        // if the provided gguf_context is no_alloc, then we create "empty" tensors and do not read the binary blob
        // otherwise, we load the binary blob into the created ggml_context as well, and point the "data" members of
        //   the ggml_tensor structs to the appropriate locations in the binary blob

        // compute the exact size needed for the new ggml_context
        const size_t mem_size =
            params.no_alloc ?
            (n_tensors    )*ggml_tensor_overhead() :
            (n_tensors + 1)*ggml_tensor_overhead() + ctx->size;

        struct ggml_init_params pdata = {
            /*mem_size   =*/ mem_size,
            /*mem_buffer =*/ nullptr,
            /*no_alloc   =*/ params.no_alloc,
        };

        *params.ctx = ggml_init(pdata);
        if (*params.ctx == nullptr) {
            fprintf(stderr, "%s: failed to initialize ggml context for storing tensors\n", __func__);
            gguf_free(ctx);
            return nullptr;
        }

        struct ggml_context * ctx_data = *params.ctx;

        struct ggml_tensor * data = nullptr;

        if (!params.no_alloc) {
            data = ggml_new_tensor_1d(ctx_data, GGML_TYPE_I8, ctx->size);

            ok = ok && data != nullptr;

            if (ok) {
                ggml_set_name(data, "GGUF tensor data binary blob");
            }

            // read the binary blob with the tensor data
            ok = ok && gr.read(data->data, ctx->size);

            if (!ok) {
                fprintf(stderr, "%s: failed to read tensor data binary blob\n", __func__);
                ggml_free(ctx_data);
                *params.ctx = nullptr;
                gguf_free(ctx);
                return nullptr;
            }

            ctx->data = data->data;
        }

        ggml_set_no_alloc(ctx_data, true);

        // create the tensors
        for (size_t i = 0; i < ctx->info.size(); ++i) {
            const struct gguf_tensor_info & info = ctx->info[i];

            struct ggml_tensor * cur = ggml_new_tensor(ctx_data, info.t.type, GGML_MAX_DIMS, info.t.ne);

            ok = ok && cur != nullptr;

            if (!ok) {
                break;
            }

            ggml_set_name(cur, info.t.name);

            // point the data member to the appropriate location in the binary blob using the tensor info
            if (!params.no_alloc) {
                cur->data = (char *) data->data + info.offset;
            }
        }

        if (!ok) {
            fprintf(stderr, "%s: failed to create tensors\n", __func__);
            ggml_free(ctx_data);
            *params.ctx = nullptr;
            gguf_free(ctx);
            return nullptr;
        }

        ggml_set_no_alloc(ctx_data, params.no_alloc);
    }

    return ctx;
}